

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive.h
# Opt level: O0

void __thiscall serialization::json_iarchive::load_key_start(json_iarchive *this,char *key)

{
  bool bVar1;
  reference ppGVar2;
  Pointer pVVar3;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_38;
  Pointer local_30;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_28;
  ConstMemberIterator iter;
  char *pcStack_18;
  serialization_trace trace;
  char *key_local;
  json_iarchive *this_local;
  
  pcStack_18 = key;
  serialization_trace::serialization_trace<char_const(&)[15],char_const*&>
            ((serialization_trace *)((long)&iter.ptr_ + 7),(char (*) [15])"load_key_start",
             &stack0xffffffffffffffe8);
  bVar1 = std::
          stack<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::deque<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>_>
          ::empty(&this->stack_);
  if (!bVar1) {
    ppGVar2 = std::
              stack<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::deque<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>_>
              ::top(&this->stack_);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsObject(*ppGVar2);
    if (bVar1) goto LAB_0013e676;
  }
  throw_serialization_error("expect key",pcStack_18);
LAB_0013e676:
  ppGVar2 = std::
            stack<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::deque<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>_>
            ::top(&this->stack_);
  local_28.ptr_ =
       (Pointer)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::FindMember(*ppGVar2,pcStack_18);
  ppGVar2 = std::
            stack<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::deque<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>_>
            ::top(&this->stack_);
  local_30 = (Pointer)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::MemberEnd(*ppGVar2);
  bVar1 = rapidjson::
          GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::operator==(&local_28,(ConstIterator)local_30);
  if (bVar1) {
    throw_serialization_error("expect key",pcStack_18);
  }
  pVVar3 = rapidjson::
           GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::operator->(&local_28);
  local_38 = &pVVar3->value;
  std::
  stack<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::deque<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>_>
  ::push(&this->stack_,&local_38);
  return;
}

Assistant:

void load_key_start(const char * key) const
    {
        serialization_trace trace(__func__, key);

        if(stack_.empty() || (!stack_.top()->IsObject()))
            throw_serialization_error("expect key", key);

        auto iter = stack_.top()->FindMember(key);
        if(iter == stack_.top()->MemberEnd())
            throw_serialization_error("expect key", key);

        stack_.push(&iter->value);
    }